

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O2

void __thiscall gimage::JPEGImageIO::save(JPEGImageIO *this,ImageU8 *image,char *name)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  void *pvVar3;
  IOException *pIVar4;
  long i;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long k;
  long lVar8;
  allocator local_389;
  void *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  jpeg_error_mgr jerr;
  undefined8 local_278 [6];
  undefined8 local_248;
  int local_240;
  int local_23c;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 != '\0') && ((image->depth | 2U) == 3)) {
    __stream = fopen(name,"wb");
    if (__stream != (FILE *)0x0) {
      local_278[0] = jpeg_std_error(&jerr);
      jpeg_CreateCompress(local_278,0x50,0x248);
      jpeg_stdio_dest(local_278,__stream);
      local_248 = CONCAT44((int)image->height,(int)image->width);
      local_240 = image->depth;
      local_23c = (local_240 == 3) + 1;
      jpeg_set_defaults(local_278);
      jpeg_set_quality(local_278,0x5a,1);
      jpeg_start_compress(local_278,1);
      uVar2 = (long)image->depth * image->width;
      uVar7 = 0xffffffffffffffff;
      if (-1 < (long)uVar2) {
        uVar7 = uVar2;
      }
      local_388 = operator_new__(uVar7);
      for (lVar8 = 0; lVar8 < image->height; lVar8 = lVar8 + 1) {
        pvVar3 = local_388;
        for (lVar5 = 0; lVar5 < image->width; lVar5 = lVar5 + 1) {
          for (lVar6 = 0; lVar6 < image->depth; lVar6 = lVar6 + 1) {
            *(uchar *)((long)pvVar3 + lVar6) = image->img[lVar6][lVar8][lVar5];
          }
          pvVar3 = (void *)((long)pvVar3 + lVar6);
        }
        jpeg_write_scanlines(local_278,&local_388,1);
      }
      jpeg_finish_compress(local_278);
      if (local_388 != (void *)0x0) {
        operator_delete__(local_388);
      }
      fclose(__stream);
      jpeg_destroy_compress(local_278);
      return;
    }
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_380,name,&local_389);
    std::operator+(&local_360,"Cannot open file for writing (",&local_380);
    std::operator+(&local_340,&local_360,")");
    gutil::IOException::IOException(pIVar4,&local_340);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_380,name,&local_389);
  std::operator+(&local_360,"Can only save JPG images with depth 1 or 3 (",&local_380);
  std::operator+(&local_340,&local_360,")");
  gutil::IOException::IOException(pIVar4,&local_340);
  __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void JPEGImageIO::save(const ImageU8 &image, const char *name) const
{
  struct jpeg_compress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *out=0;

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save JPG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // open output file using C methods

  out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file for writing ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  jpeg_stdio_dest(&cinfo, out);

  // set image size, color space and quality

  cinfo.image_width=static_cast<JDIMENSION>(image.getWidth());
  cinfo.image_height=static_cast<JDIMENSION>(image.getHeight());
  cinfo.input_components=image.getDepth();

  cinfo.in_color_space=JCS_GRAYSCALE;

  if (image.getDepth() == 3)
  {
    cinfo.in_color_space=JCS_RGB;
  }

  jpeg_set_defaults(&cinfo);
  jpeg_set_quality(&cinfo, 90, TRUE);

  // start compression

  jpeg_start_compress(&cinfo, TRUE);
  row=new JSAMPLE [image.getWidth()*image.getDepth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    JSAMPROW rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=static_cast<JSAMPLE>(image.get(i, k, j));
      }
    }

    jpeg_write_scanlines(&cinfo, &row, 1);
  }

  // finish compression and close stream

  jpeg_finish_compress(&cinfo);
  delete [] row;

  fclose(out);

  jpeg_destroy_compress(&cinfo);
}